

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool common_params_parse_ex(int argc,char **argv,common_params_context *ctx_arg)

{
  _func_void_common_params_ptr_int *p_Var1;
  FILE *__stream;
  code *pcVar2;
  reference pcVar3;
  common_params *pcVar4;
  bool bVar5;
  int iVar6;
  mapped_type *ppcVar7;
  string *psVar8;
  invalid_argument *piVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  const_iterator plVar12;
  reference pvVar13;
  ulong uVar14;
  runtime_error *this;
  char *pcVar15;
  llama_example *in_RDX;
  int in_EDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq_breaker;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *antiprompt;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  llama_example *ex;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  initializer_list<llama_example> *__range1_2;
  handle_model_result res;
  exception *e_1;
  string val2;
  string val;
  common_arg opt_2;
  string arg_2;
  string arg_prefix_1;
  int i;
  anon_class_8_1_89897dcb check_arg;
  exception *e;
  string value;
  common_arg *opt_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<common_arg,_std::allocator<common_arg>_> *__range1_1;
  char **arg_1;
  iterator __end2;
  iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  common_arg *opt;
  iterator __end1;
  iterator __begin1;
  vector<common_arg,_std::allocator<common_arg>_> *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
  arg_to_options;
  common_params *params;
  string arg_prefix;
  string arg;
  cpu_params *in_stack_fffffffffffff688;
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff698;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6a0;
  common_params_vocoder *this_00;
  common_arg *in_stack_fffffffffffff6b8;
  common_arg *in_stack_fffffffffffff6c0;
  string *input;
  char *in_stack_fffffffffffff6c8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d0;
  string local_790 [32];
  undefined8 local_770;
  undefined8 local_768;
  reference local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_758;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_748;
  reference local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_730;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_728;
  allocator<char> local_719;
  string *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  common_params_model *in_stack_fffffffffffff8f8;
  allocator<char> local_669;
  string local_668 [175];
  allocator<char> in_stack_fffffffffffffa47;
  string *in_stack_fffffffffffffa48;
  const_iterator local_500;
  allocator<char> local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9 [136];
  allocator<char> local_461;
  string local_460 [32];
  byte local_440;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [168];
  undefined8 local_290;
  code *local_260;
  code *local_258;
  code *local_250;
  code *local_248;
  undefined1 local_239;
  string local_238 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_true>
  local_218;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_true>
  local_210;
  undefined1 local_202;
  undefined1 local_201;
  undefined8 local_200;
  undefined8 local_1f8;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [36];
  int local_19c;
  int *local_198;
  int local_15c;
  string local_158;
  reference local_138;
  common_arg *local_130;
  __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_> local_128;
  llama_example *local_120;
  allocator<char> local_111;
  string local_110 [32];
  reference local_f0;
  char **local_e8;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_d8;
  reference local_d0;
  common_arg *local_c8;
  __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_> local_c0;
  llama_example *local_b8;
  common_params *local_78;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  llama_example *local_18;
  int local_4;
  
  local_18 = in_RDX;
  local_4 = in_EDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
             (allocator<char> *)in_stack_fffffffffffff6c0);
  std::allocator<char>::~allocator(&local_59);
  local_78 = *(common_params **)(local_18 + 2);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                   *)0x221cdc);
  local_b8 = local_18 + 4;
  local_c0._M_current =
       (common_arg *)
       std::vector<common_arg,_std::allocator<common_arg>_>::begin
                 ((vector<common_arg,_std::allocator<common_arg>_> *)in_stack_fffffffffffff688);
  local_c8 = (common_arg *)
             std::vector<common_arg,_std::allocator<common_arg>_>::end
                       ((vector<common_arg,_std::allocator<common_arg>_> *)in_stack_fffffffffffff688
                       );
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                            (__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_stack_fffffffffffff688), bVar5) {
    local_d0 = __gnu_cxx::
               __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
               ::operator*(&local_c0);
    local_d8 = &local_d0->args;
    local_e0._M_current =
         (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                             in_stack_fffffffffffff688);
    local_e8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   in_stack_fffffffffffff688);
    while (bVar5 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                              (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                               *)in_stack_fffffffffffff688), bVar5) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                 ::operator*(&local_e0);
      pcVar3 = local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                 (allocator<char> *)in_stack_fffffffffffff6c0);
      ppcVar7 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                              *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                             (key_type *)in_stack_fffffffffffff688);
      *ppcVar7 = pcVar3;
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&local_e0);
    }
    __gnu_cxx::
    __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
    operator++(&local_c0);
  }
  local_120 = local_18 + 4;
  local_128._M_current =
       (common_arg *)
       std::vector<common_arg,_std::allocator<common_arg>_>::begin
                 ((vector<common_arg,_std::allocator<common_arg>_> *)in_stack_fffffffffffff688);
  local_130 = (common_arg *)
              std::vector<common_arg,_std::allocator<common_arg>_>::end
                        ((vector<common_arg,_std::allocator<common_arg>_> *)
                         in_stack_fffffffffffff688);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                            (__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_stack_fffffffffffff688), bVar5) {
    local_138 = __gnu_cxx::
                __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                ::operator*(&local_128);
    std::__cxx11::string::string((string *)&local_158);
    bVar5 = common_arg::get_value_from_env
                      ((common_arg *)in_stack_fffffffffffff698._M_current,
                       (string *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
    if (bVar5) {
      if ((local_138->handler_void != (_func_void_common_params_ptr *)0x0) &&
         ((bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                   (char *)in_stack_fffffffffffff688), bVar5 ||
          (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                   (char *)in_stack_fffffffffffff688), bVar5)))) {
        (*local_138->handler_void)(local_78);
      }
      pcVar4 = local_78;
      if (local_138->handler_int != (_func_void_common_params_ptr_int *)0x0) {
        p_Var1 = local_138->handler_int;
        iVar6 = std::__cxx11::stoi((string *)
                                   CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                   (size_t *)in_stack_fffffffffffff688,0);
        (*p_Var1)(pcVar4,iVar6);
      }
      if (local_138->handler_string == (_func_void_common_params_ptr_string_ptr *)0x0)
      goto LAB_00222245;
      (*local_138->handler_string)(local_78,&local_158);
      local_15c = 7;
    }
    else {
LAB_00222245:
      local_15c = 0;
    }
    std::__cxx11::string::~string((string *)&local_158);
    __gnu_cxx::
    __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
    operator++(&local_128);
  }
  local_198 = &local_4;
  for (local_19c = 1; local_19c < local_4; local_19c = local_19c + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(&local_1e9);
    psVar8 = (string *)std::__cxx11::string::size();
    iVar6 = std::__cxx11::string::compare((ulong)local_1e8,0,psVar8);
    if (iVar6 == 0) {
      local_1f8 = std::__cxx11::string::begin();
      local_200 = std::__cxx11::string::end();
      local_201 = 0x5f;
      local_202 = 0x2d;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                 (char *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                 (char *)in_stack_fffffffffffff688);
    }
    local_210._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                 *)in_stack_fffffffffffff688,(key_type *)0x22248d);
    local_218._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                *)in_stack_fffffffffffff688);
    bVar5 = std::__detail::operator==(&local_210,&local_218);
    if (bVar5) {
      local_239 = 1;
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      uVar10 = std::__cxx11::string::c_str();
      string_format_abi_cxx11_((char *)local_238,"error: invalid argument: %s",uVar10);
      std::invalid_argument::invalid_argument(piVar9,local_238);
      local_239 = 0;
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                  *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                 (key_type *)in_stack_fffffffffffff688);
    common_arg::common_arg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    bVar5 = common_arg::has_value_from_env
                      ((common_arg *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
    uVar10 = local_290;
    __stream = _stderr;
    if (bVar5) {
      uVar11 = std::__cxx11::string::c_str();
      fprintf(__stream,
              "warn: %s environment variable is set, but will be overwritten by command line argument %s\n"
              ,uVar10,uVar11);
    }
    if (local_260 == (code *)0x0) {
      common_params_parse_ex::anon_class_8_1_89897dcb::operator()
                ((anon_class_8_1_89897dcb *)in_stack_fffffffffffff6a0._M_current,
                 (int)((ulong)in_stack_fffffffffffff698._M_current >> 0x20));
      local_19c = local_19c + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                 (allocator<char> *)in_stack_fffffffffffff6c0);
      std::allocator<char>::~allocator(&local_339);
      pcVar4 = local_78;
      pcVar2 = local_248;
      if (local_248 == (code *)0x0) {
        if (local_258 == (code *)0x0) {
          common_params_parse_ex::anon_class_8_1_89897dcb::operator()
                    ((anon_class_8_1_89897dcb *)in_stack_fffffffffffff6a0._M_current,
                     (int)((ulong)in_stack_fffffffffffff698._M_current >> 0x20));
          local_19c = local_19c + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                     (allocator<char> *)in_stack_fffffffffffff6c0);
          std::allocator<char>::~allocator(&local_361);
          if (local_250 == (code *)0x0) {
            local_15c = 0;
          }
          else {
            (*local_250)(local_78,local_338,local_360);
            local_15c = 10;
          }
          std::__cxx11::string::~string(local_360);
        }
        else {
          (*local_258)(local_78,local_338);
          local_15c = 10;
        }
      }
      else {
        iVar6 = std::__cxx11::stoi((string *)
                                   CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                   (size_t *)in_stack_fffffffffffff688,0);
        (*pcVar2)(pcVar4,iVar6);
        local_15c = 10;
      }
      std::__cxx11::string::~string(local_338);
      if (local_15c == 0) {
        local_15c = 0;
      }
    }
    else {
      (*local_260)(local_78);
      local_15c = 10;
    }
    common_arg::~common_arg
              ((common_arg *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1c0);
  }
  postprocess_cpu_params
            ((cpu_params *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             in_stack_fffffffffffff688);
  postprocess_cpu_params
            ((cpu_params *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             in_stack_fffffffffffff688);
  postprocess_cpu_params
            ((cpu_params *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             in_stack_fffffffffffff688);
  postprocess_cpu_params
            ((cpu_params *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             in_stack_fffffffffffff688);
  if (((local_78->prompt_cache_all & 1U) != 0) &&
     (((local_78->interactive & 1U) != 0 || ((local_78->interactive_first & 1U) != 0)))) {
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar9,"error: --prompt-cache-all not supported in interactive mode yet\n");
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
             (allocator<char> *)in_stack_fffffffffffff6c0);
  common_params_handle_model
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  if ((local_78->no_mmproj & 1U) == 0) {
    if ((((local_440 & 1) != 0) && (uVar14 = std::__cxx11::string::empty(), (uVar14 & 1) != 0)) &&
       (uVar14 = std::__cxx11::string::empty(), (uVar14 & 1) != 0)) {
      common_params_model::operator=
                ((common_params_model *)
                 CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                 (common_params_model *)in_stack_fffffffffffff688);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(&local_4ea);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(&local_4eb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
               (allocator<char> *)in_stack_fffffffffffff6c0);
    std::allocator<char>::~allocator(&local_4ec);
    common_params_model::operator=
              ((common_params_model *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               (common_params_model *)in_stack_fffffffffffff688);
    common_params_model::~common_params_model
              ((common_params_model *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690))
    ;
  }
  local_500 = std::initializer_list<llama_example>::begin(&mmproj_examples);
  plVar12 = std::initializer_list<llama_example>::end
                      ((initializer_list<llama_example> *)
                       CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
  do {
    if (local_500 == plVar12) {
LAB_002231a6:
      input = &local_78->hf_token;
      __s = &local_669;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d0,(char *)__s,(allocator<char> *)input);
      common_params_handle_model
                (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      handle_model_result::~handle_model_result((handle_model_result *)0x223223);
      std::__cxx11::string::~string(local_668);
      std::allocator<char>::~allocator(&local_669);
      this_00 = &local_78->vocoder;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d0,(char *)__s,(allocator<char> *)input);
      common_params_handle_model
                (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      handle_model_result::~handle_model_result((handle_model_result *)0x2232ba);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff8e8);
      std::allocator<char>::~allocator(&local_719);
      handle_model_result::~handle_model_result((handle_model_result *)0x2232e1);
      if ((local_78->escape & 1U) != 0) {
        string_process_escapes(input);
        string_process_escapes(input);
        string_process_escapes(input);
        local_728 = &local_78->antiprompt;
        local_730._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff688);
        local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff688);
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff688), bVar5) {
          local_740 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_730);
          string_process_escapes(input);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_730);
        }
        local_748 = &(local_78->sampling).dry_sequence_breakers;
        local_750._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff688);
        local_758 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff688);
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff688), bVar5) {
          local_760 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_750);
          string_process_escapes(input);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_750);
        }
      }
      bVar5 = std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::empty
                        ((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
                          *)this_00);
      if (!bVar5) {
        std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
        emplace_back<>((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *)
                       CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
        pvVar13 = std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
                  back((vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *)
                       CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
        pvVar13->key[0] = '\0';
      }
      bVar5 = std::
              vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
              ::empty((vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                       *)this_00);
      if (!bVar5) {
        local_770 = 0;
        local_768 = 0;
        std::
        vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ::push_back((vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                     *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
                    (value_type *)in_stack_fffffffffffff688);
      }
      if (((local_78->reranking & 1U) != 0) && ((local_78->embedding & 1U) != 0)) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar9,"error: either --embedding or --reranking can be specified, but not both")
        ;
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      uVar14 = std::__cxx11::string::empty();
      if (((uVar14 & 1) == 0) &&
         (bVar5 = common_chat_verify_template
                            (in_stack_fffffffffffffa48,(bool)in_stack_fffffffffffffa47), !bVar5)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar10 = std::__cxx11::string::c_str();
        pcVar15 = 
        "\nnote: llama.cpp was started without --jinja, we only support commonly used templates";
        if ((local_78->use_jinja & 1U) != 0) {
          pcVar15 = "";
        }
        string_format_abi_cxx11_
                  ((char *)local_790,"error: the supplied chat template is not supported: %s%s\n",
                   uVar10,pcVar15);
        std::runtime_error::runtime_error(this,local_790);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_15c = 1;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
                        *)0x223770);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      return true;
    }
    if (*local_18 == *local_500) {
      in_stack_fffffffffffff6d0 = &(local_78->mmproj).path;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                 (allocator<char> *)in_stack_fffffffffffff6c0);
      common_params_handle_model
                (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      handle_model_result::~handle_model_result((handle_model_result *)0x223126);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa47);
      goto LAB_002231a6;
    }
    local_500 = local_500 + 1;
  } while( true );
}

Assistant:

static bool common_params_parse_ex(int argc, char ** argv, common_params_context & ctx_arg) {
    std::string arg;
    const std::string arg_prefix = "--";
    common_params & params = ctx_arg.params;

    std::unordered_map<std::string, common_arg *> arg_to_options;
    for (auto & opt : ctx_arg.options) {
        for (const auto & arg : opt.args) {
            arg_to_options[arg] = &opt;
        }
    }

    // handle environment variables
    for (auto & opt : ctx_arg.options) {
        std::string value;
        if (opt.get_value_from_env(value)) {
            try {
                if (opt.handler_void && (value == "1" || value == "true")) {
                    opt.handler_void(params);
                }
                if (opt.handler_int) {
                    opt.handler_int(params, std::stoi(value));
                }
                if (opt.handler_string) {
                    opt.handler_string(params, value);
                    continue;
                }
            } catch (std::exception & e) {
                throw std::invalid_argument(string_format(
                    "error while handling environment variable \"%s\": %s\n\n", opt.env, e.what()));
            }
        }
    }

    // handle command line arguments
    auto check_arg = [&](int i) {
        if (i+1 >= argc) {
            throw std::invalid_argument("expected value for argument");
        }
    };

    for (int i = 1; i < argc; i++) {
        const std::string arg_prefix = "--";

        std::string arg = argv[i];
        if (arg.compare(0, arg_prefix.size(), arg_prefix) == 0) {
            std::replace(arg.begin(), arg.end(), '_', '-');
        }
        if (arg_to_options.find(arg) == arg_to_options.end()) {
            throw std::invalid_argument(string_format("error: invalid argument: %s", arg.c_str()));
        }
        auto opt = *arg_to_options[arg];
        if (opt.has_value_from_env()) {
            fprintf(stderr, "warn: %s environment variable is set, but will be overwritten by command line argument %s\n", opt.env, arg.c_str());
        }
        try {
            if (opt.handler_void) {
                opt.handler_void(params);
                continue;
            }

            // arg with single value
            check_arg(i);
            std::string val = argv[++i];
            if (opt.handler_int) {
                opt.handler_int(params, std::stoi(val));
                continue;
            }
            if (opt.handler_string) {
                opt.handler_string(params, val);
                continue;
            }

            // arg with 2 values
            check_arg(i);
            std::string val2 = argv[++i];
            if (opt.handler_str_str) {
                opt.handler_str_str(params, val, val2);
                continue;
            }
        } catch (std::exception & e) {
            throw std::invalid_argument(string_format(
                "error while handling argument \"%s\": %s\n\n"
                "usage:\n%s\n\nto show complete usage, run with -h",
                arg.c_str(), e.what(), arg_to_options[arg]->to_string().c_str()));
        }
    }

    postprocess_cpu_params(params.cpuparams,       nullptr);
    postprocess_cpu_params(params.cpuparams_batch, &params.cpuparams);

    postprocess_cpu_params(params.speculative.cpuparams,       &params.cpuparams);
    postprocess_cpu_params(params.speculative.cpuparams_batch, &params.cpuparams_batch);

    if (params.prompt_cache_all && (params.interactive || params.interactive_first)) {
        throw std::invalid_argument("error: --prompt-cache-all not supported in interactive mode yet\n");
    }

    // handle model and download
    {
        auto res = common_params_handle_model(params.model, params.hf_token, DEFAULT_MODEL_PATH);
        if (params.no_mmproj) {
            params.mmproj = {};
        } else if (res.found_mmproj && params.mmproj.path.empty() && params.mmproj.url.empty()) {
            // optionally, handle mmproj model when -hf is specified
            params.mmproj = res.mmproj;
        }
        // only download mmproj if the current example is using it
        for (auto & ex : mmproj_examples) {
            if (ctx_arg.ex == ex) {
                common_params_handle_model(params.mmproj,    params.hf_token, "");
                break;
            }
        }
        common_params_handle_model(params.speculative.model, params.hf_token, "");
        common_params_handle_model(params.vocoder.model,     params.hf_token, "");
    }

    if (params.escape) {
        string_process_escapes(params.prompt);
        string_process_escapes(params.input_prefix);
        string_process_escapes(params.input_suffix);
        for (auto & antiprompt : params.antiprompt) {
            string_process_escapes(antiprompt);
        }
        for (auto & seq_breaker : params.sampling.dry_sequence_breakers) {
            string_process_escapes(seq_breaker);
        }
    }

    if (!params.kv_overrides.empty()) {
        params.kv_overrides.emplace_back();
        params.kv_overrides.back().key[0] = 0;
    }

    if (!params.tensor_buft_overrides.empty()) {
        params.tensor_buft_overrides.push_back({nullptr, nullptr});
    }

    if (params.reranking && params.embedding) {
        throw std::invalid_argument("error: either --embedding or --reranking can be specified, but not both");
    }

    if (!params.chat_template.empty() && !common_chat_verify_template(params.chat_template, params.use_jinja)) {
        throw std::runtime_error(string_format(
            "error: the supplied chat template is not supported: %s%s\n",
            params.chat_template.c_str(),
            params.use_jinja ? "" : "\nnote: llama.cpp was started without --jinja, we only support commonly used templates"
        ));
    }

    return true;
}